

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

string * __thiscall
punky::tok::type_to_string_abi_cxx11_(string *__return_storage_ptr__,tok *this,TokenType *type)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "(";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "RIGHT_PAREN";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "LEFT_BRACKET";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "RIGHT_BRACKET";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "LEFT_BRACE";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "RIGHT_BRACE";
    pcVar2 = "";
    break;
  case 6:
    pcVar3 = "COMMA";
    pcVar2 = "";
    break;
  case 7:
    pcVar3 = "DOT";
    pcVar2 = "";
    break;
  case 8:
    pcVar3 = "-";
    pcVar2 = "";
    break;
  case 9:
    pcVar3 = "+";
    pcVar2 = "";
    break;
  case 10:
    pcVar3 = "/";
    pcVar2 = "";
    break;
  case 0xb:
    pcVar3 = "*";
    pcVar2 = "";
    break;
  case 0xc:
    pcVar3 = ":";
    pcVar2 = "";
    break;
  case 0xd:
    pcVar3 = ";";
    pcVar2 = "";
    break;
  case 0xe:
    pcVar3 = "!";
    pcVar2 = "";
    break;
  case 0xf:
    pcVar3 = "!=";
    pcVar2 = "";
    break;
  case 0x10:
    pcVar3 = "=";
    pcVar2 = "";
    break;
  case 0x11:
    pcVar3 = "==";
    pcVar2 = "";
    break;
  case 0x12:
    pcVar3 = ">";
    pcVar2 = "";
    break;
  case 0x13:
    pcVar3 = ">=";
    pcVar2 = "";
    break;
  case 0x14:
    pcVar3 = "<";
    pcVar2 = "";
    break;
  case 0x15:
    pcVar3 = "<=";
    pcVar2 = "";
    break;
  case 0x16:
    pcVar3 = "IDENTIFIER";
    pcVar2 = "";
    break;
  case 0x17:
    pcVar3 = "STRING";
    pcVar2 = "";
    break;
  case 0x18:
    pcVar3 = "INT";
    pcVar2 = "";
    break;
  case 0x19:
    pcVar3 = "fn";
    pcVar2 = "";
    break;
  case 0x1a:
    pcVar3 = "let";
    pcVar2 = "";
    break;
  case 0x1b:
    pcVar3 = "true";
    pcVar2 = "";
    break;
  case 0x1c:
    pcVar3 = "false";
    pcVar2 = "";
    break;
  case 0x1d:
    pcVar3 = "if";
    pcVar2 = "";
    break;
  case 0x1e:
    pcVar3 = "ELSE";
    pcVar2 = "";
    break;
  case 0x1f:
    pcVar3 = "return";
    pcVar2 = "";
    break;
  case 0x20:
    pcVar3 = "ILLEGAL";
    pcVar2 = "";
    break;
  case 0x21:
    pcVar3 = "EOS";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "DEFAULT - UNREACHABLE";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string type_to_string(const TokenType& type)
{
    switch (type)
    {
        case TokenType::LeftParen:
            return "(";
        case TokenType::RightParen:
            return "RIGHT_PAREN";
        case TokenType::LeftBracket:
            return "LEFT_BRACKET";
        case TokenType::RightBracket:
            return "RIGHT_BRACKET";
        case TokenType::LeftBrace:
            return "LEFT_BRACE";
        case TokenType::RightBrace:
            return "RIGHT_BRACE";
        case TokenType::Comma:
            return "COMMA";
        case TokenType::Dot:
            return "DOT";
        case TokenType::Minus:
            return "-";
        case TokenType::Plus:
            return "+";
        case TokenType::Slash:
            return "/";
        case TokenType::Asterisk:
            return "*";
        case TokenType::Colon:
            return ":";
        case TokenType::Semicolon:
            return ";";
        case TokenType::Bang:
            return "!";
        case TokenType::BangEqual:
            return "!=";
        case TokenType::Equal:
            return "=";
        case TokenType::EqualEqual:
            return "==";
        case TokenType::Greater:
            return ">";
        case TokenType::GreaterEqual:
            return ">=";
        case TokenType::Less:
            return "<";
        case TokenType::LessEqual:
            return "<=";
        case TokenType::Identifier:
            return "IDENTIFIER";
        case TokenType::String:
            return "STRING";
        case TokenType::Int:
            return "INT";
        case TokenType::Func:
            return "fn";
        case TokenType::Let:
            return "let";
        case TokenType::True:
            return "true";
        case TokenType::False:
            return "false";
        case TokenType::If:
            return "if";
        case TokenType::Else:
            return "ELSE";
        case TokenType::Return:
            return "return";
        case TokenType::Illegal:
            return "ILLEGAL";
        case TokenType::EOS:
            return "EOS";
        default:
            return "DEFAULT - UNREACHABLE";
    }
}